

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ApproxQuantileState,duckdb::dtime_tz_t,duckdb::ApproxQuantileScalarOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  dtime_tz_t *input_00;
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_a0;
  AggregateUnaryInput local_58;
  ValidityMask *local_40;
  unsigned_long *local_38;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_a0.data = (data_ptr_t)&input->validity;
    local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      local_a0.sel = (SelectionVector *)aggr_input_data;
      local_40 = (ValidityMask *)local_a0.data;
      local_38 = (unsigned_long *)count;
      do {
        puVar3 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar7 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar7[uVar6];
        }
        puVar7 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8;
        if (local_38 <=
            local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8) {
          puVar7 = local_38;
        }
        puVar4 = puVar7;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) {
            for (; puVar4 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar7;
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              ApproxQuantileOperation::
              Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                        ((ApproxQuantileState *)state,
                         (dtime_tz_t *)
                         (pdVar1 + (long)local_a0.validity.
                                         super_TemplatedValidityMask<unsigned_long>.validity_mask *
                                   8),(AggregateUnaryInput *)&local_a0);
            }
          }
          else {
            for (; puVar4 = local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar7;
                local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_a0.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              if ((uVar5 >> ((ulong)(uint)((int)local_a0.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar3) & 0x3f) & 1) != 0) {
                ApproxQuantileOperation::
                Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                          ((ApproxQuantileState *)state,
                           (dtime_tz_t *)
                           (pdVar1 + (long)local_a0.validity.
                                           super_TemplatedValidityMask<unsigned_long>.validity_mask
                                     * 8),(AggregateUnaryInput *)&local_a0);
              }
            }
          }
        }
        local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar7 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
      input_00 = (dtime_tz_t *)input->data;
      local_a0.data = (data_ptr_t)&input->validity;
      local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      if (count != 0) {
        local_a0.sel = (SelectionVector *)aggr_input_data;
        do {
          ApproxQuantileOperation::
          Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                    ((ApproxQuantileState *)state,input_00,(AggregateUnaryInput *)&local_a0);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_a0);
    Vector::ToUnifiedFormat(input,count,&local_a0);
    local_58.input_mask = &local_a0.validity;
    local_58.input_idx = 0;
    local_58.input = aggr_input_data;
    if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = (local_a0.sel)->sel_vector;
        uVar6 = 0;
        do {
          local_58.input_idx = uVar6;
          if (psVar2 != (sel_t *)0x0) {
            local_58.input_idx = (idx_t)psVar2[uVar6];
          }
          ApproxQuantileOperation::
          Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                    ((ApproxQuantileState *)state,
                     (dtime_tz_t *)(local_a0.data + local_58.input_idx * 8),&local_58);
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      psVar2 = (local_a0.sel)->sel_vector;
      uVar6 = 0;
      do {
        local_58.input_idx = uVar6;
        if (psVar2 != (sel_t *)0x0) {
          local_58.input_idx = (idx_t)psVar2[uVar6];
        }
        if ((local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_58.input_idx >> 6] >> (local_58.input_idx & 0x3f) & 1) != 0)) {
          ApproxQuantileOperation::
          Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                    ((ApproxQuantileState *)state,
                     (dtime_tz_t *)(local_a0.data + local_58.input_idx * 8),&local_58);
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_a0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}